

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

void fiber_init_toplevel(Fiber *fbr)

{
  fbr->stack = (void *)0x0;
  fbr->alloc_stack = (void *)0x0;
  fbr->stack_size = 0xffffffffffffffff;
  (fbr->regs).sp = (void *)0x0;
  (fbr->regs).lr = (void *)0x0;
  (fbr->regs).rbp = (void *)0x0;
  (fbr->regs).rbx = (void *)0x0;
  (fbr->regs).r12 = (void *)0x0;
  (fbr->regs).r13 = (void *)0x0;
  (fbr->regs).r14 = (void *)0x0;
  (fbr->regs).r15 = (void *)0x0;
  fbr->state = 7;
  return;
}

Assistant:

void
fiber_init_toplevel(Fiber *fbr)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    fbr->stack = NULL;
    fbr->stack_size = (size_t) -1;
    fbr->alloc_stack = NULL;
    memset(&fbr->regs, 0, sizeof fbr->regs);
    fbr->state = FIBER_FS_ALIVE | FIBER_FS_TOPLEVEL | FIBER_FS_EXECUTING;
}